

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBoolean.c
# Opt level: O0

void JsBooleanInit(JsVm *vm)

{
  JsObject *boolean_00;
  JsObject *boolean_proto_00;
  JsValue *pJVar1;
  JsValue *v;
  JsObject *boolean_proto;
  JsObject *boolean;
  JsVm *vm_local;
  
  boolean_00 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,1);
  boolean_proto_00 = JsCreateBooleanObject((JsObject *)0x0,0);
  JsBooleanFunctionInit(boolean_00,boolean_proto_00);
  JsBooleanProtoInit(boolean_00,boolean_proto_00);
  pJVar1 = (JsValue *)JsMalloc(0x18);
  pJVar1->type = JS_OBJECT;
  (pJVar1->u).object = boolean_00;
  (*vm->Global->Put)(vm->Global,"Boolean",pJVar1,7);
  return;
}

Assistant:

void JsBooleanInit(struct JsVm* vm){
	
	struct JsObject* boolean = JsCreateStandardFunctionObject(NULL,NULL,TRUE);
	struct JsObject* boolean_proto = JsCreateBooleanObject(NULL,FALSE);
	
	JsBooleanFunctionInit(boolean,boolean_proto);
	JsBooleanProtoInit(boolean,boolean_proto);
	struct JsValue* v = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	v->type = JS_OBJECT;
	v->u.object = boolean;
	(*vm->Global->Put)(vm->Global,"Boolean",v,JS_OBJECT_ATTR_STRICT);
}